

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

size_t encodeCobs(void *buffer,void *p,size_t size)

{
  char cVar1;
  char *pcVar2;
  char cVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  
  pcVar2 = (char *)((long)buffer + 1);
  pcVar6 = (char *)buffer;
  if (size == 0) {
    cVar3 = '\x01';
  }
  else {
    cVar3 = '\x01';
    sVar4 = 0;
    do {
      cVar1 = *(char *)((long)p + sVar4);
      pcVar5 = pcVar2;
      if (cVar1 != '\0') {
        *pcVar2 = cVar1;
        pcVar5 = pcVar2 + 1;
        cVar3 = cVar3 + '\x01';
      }
      pcVar2 = pcVar5;
      if (cVar3 == -1 || cVar1 == '\0') {
        *pcVar6 = cVar3;
        cVar3 = '\x01';
        pcVar2 = pcVar5 + (size - 1 != sVar4 || cVar1 == '\0');
        pcVar6 = pcVar5;
      }
      sVar4 = sVar4 + 1;
    } while (size != sVar4);
  }
  *pcVar6 = cVar3;
  return (long)pcVar2 - (long)buffer;
}

Assistant:

size_t encodeCobs(
	void* buffer, // must be big enough
	void const* p,
	size_t size
) {
	uint8_t const* src = (uint8_t*)p;
	uint8_t* dst = (uint8_t*)buffer; // encoded byte pointer
	uint8_t* codep = dst++; // output code pointer
	uint8_t code = 1; // code value

	for (; size--; src++) {
		uint8_t c = *src;
		if (c) { // byte not zero, write it
			*dst++ = c;
			++code;
		}

		if (!c || code == 0xff) { // input is zero or block completed, restart
			*codep = code;
			code = 1;
			codep = dst;
			if (!c || size)
				++dst;
		}
	}

	*codep = code; // write final code value
	return dst - (uint8_t*)buffer;
}